

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.hpp
# Opt level: O2

IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> * __thiscall
MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices
          (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
           *__return_storage_ptr__,Span<const_int,_18446744073709551615UL> *this,size_t sliceSize)

{
  ulong uVar1;
  pointer ptVar2;
  range_error *this_00;
  
  uVar1 = (this->m_size).m_size;
  if (uVar1 % sliceSize == 0) {
    ptVar2 = this->m_ptr;
    (__return_storage_ptr__->m_begin).m_ptr = ptVar2;
    (__return_storage_ptr__->m_begin).m_stride = sliceSize;
    (__return_storage_ptr__->m_end).m_ptr = ptVar2 + uVar1;
    (__return_storage_ptr__->m_end).m_stride = sliceSize;
    return __return_storage_ptr__;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"index out of bounds");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

IteratorProvider<SliceIterator> IterateSlices(size_t sliceSize) const
    {
        MILVerifyIsTrue(Size() % sliceSize == 0, std::range_error, "index out of bounds");

        return IteratorProvider<SliceIterator>(SliceIterator(Data(), sliceSize),
                                               SliceIterator(Data() + Size(), sliceSize));
    }